

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmInstallCommandArguments.cxx
# Opt level: O2

void __thiscall
cmInstallCommandFileSetArguments::cmInstallCommandFileSetArguments
          (cmInstallCommandFileSetArguments *this,string *defaultComponent)

{
  static_string_view name;
  string sStack_38;
  
  std::__cxx11::string::string((string *)&sStack_38,(string *)defaultComponent);
  cmInstallCommandArguments::cmInstallCommandArguments
            (&this->super_cmInstallCommandArguments,&sStack_38);
  std::__cxx11::string::~string((string *)&sStack_38);
  (this->FileSet)._M_dataplus._M_p = (pointer)&(this->FileSet).field_2;
  (this->FileSet)._M_string_length = 0;
  (this->FileSet).field_2._M_local_buf[0] = '\0';
  name.super_string_view._M_str = "FILE_SET";
  name.super_string_view._M_len = 8;
  cmArgumentParser<void>::Bind<std::__cxx11::string>
            ((cmArgumentParser<void> *)this,name,&this->FileSet);
  return;
}

Assistant:

cmInstallCommandFileSetArguments::cmInstallCommandFileSetArguments(
  std::string defaultComponent)
  : cmInstallCommandArguments(std::move(defaultComponent))
{
  this->Bind("FILE_SET"_s, this->FileSet);
}